

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadCord
          (EpsCopyInputStream *this,char *ptr,int size,Cord *cord)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  if (0x1ff < iVar1) {
    iVar1 = 0x200;
  }
  if (iVar1 < size) {
    pcVar2 = ReadCordFallback(this,ptr,size,cord);
    return pcVar2;
  }
  absl::lts_20240722::Cord::operator=(cord,(long)size,ptr);
  return ptr + size;
}

Assistant:

PROTOBUF_NODISCARD const char* ReadCord(const char* ptr, int size,
                                          ::absl::Cord* cord) {
    if (size <= std::min<int>(static_cast<int>(buffer_end_ + kSlopBytes - ptr),
                              kMaxCordBytesToCopy)) {
      *cord = absl::string_view(ptr, size);
      return ptr + size;
    }
    return ReadCordFallback(ptr, size, cord);
  }